

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O2

optional<double> __thiscall
density::
conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
::try_reentrant_consume_impl
          (conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
           *this,conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
                 *param_2)

{
  double dVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_double_()> *pFVar2;
  void *pvVar3;
  undefined8 extraout_RDX;
  optional<double> oVar4;
  reentrant_consume_operation cons;
  reentrant_consume_operation local_30;
  
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::try_start_reentrant_consume(&local_30,param_2);
  if (local_30.m_consume_operation.m_control == (ControlBlock *)0x0) {
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(this->m_queue).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  }
  else {
    pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_consume_operation::complete_type(&local_30.m_consume_operation);
    pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_consume_operation::unaligned_element_ptr(&local_30.m_consume_operation);
    dVar1 = (*pFVar2->m_align_invoke_destroy)(pvVar3);
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::commit_nodestroy(&local_30);
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__size[8] = '\x01';
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__align = (long)dVar1;
  }
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_30);
  oVar4._8_8_ = extraout_RDX;
  oVar4.m_storage = (type)this;
  return oVar4;
}

Assistant:

optional<RET_VAL> try_reentrant_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_reentrant_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }